

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateVisitor.cpp
# Opt level: O3

Temporary * __thiscall
IRT::TemplateVisitor<IRT::Temporary>::Accept
          (Temporary *__return_storage_ptr__,TemplateVisitor<IRT::Temporary> *this,
          BaseElement *base_element)

{
  pointer pcVar1;
  
  (*base_element->_vptr_BaseElement[2])(base_element);
  (__return_storage_ptr__->name_)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->name_).field_2;
  pcVar1 = (this->tos_value_).name_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (this->tos_value_).name_._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

T TemplateVisitor<T>::Accept(BaseElement* base_element) {
  base_element->Accept(this);
  return tos_value_;
}